

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O3

Call * __thiscall
wasm::Builder::makeCall
          (Builder *this,Name target,
          vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *args,Type type,
          bool isReturn)

{
  Call *pCVar1;
  MixedArena *this_00;
  
  this_00 = &this->wasm->allocator;
  pCVar1 = (Call *)MixedArena::allocSpace(this_00,0x48,8);
  (pCVar1->super_SpecificExpression<(wasm::Expression::Id)6>).super_Expression._id = CallId;
  (pCVar1->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
       = (Expression **)0x0;
  (pCVar1->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  usedElements = 0;
  (pCVar1->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  allocatedElements = 0;
  (pCVar1->operands).allocator = this_00;
  pCVar1->isReturn = false;
  (pCVar1->super_SpecificExpression<(wasm::Expression::Id)6>).super_Expression.type.id = type.id;
  (pCVar1->target).super_IString.str._M_len = target.super_IString.str._M_len;
  (pCVar1->target).super_IString.str._M_str = target.super_IString.str._M_str;
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
  set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
            ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)&pCVar1->operands,
             args);
  pCVar1->isReturn = isReturn;
  return pCVar1;
}

Assistant:

Call* makeCall(Name target,
                 const std::vector<Expression*>& args,
                 Type type,
                 bool isReturn = false) {
    auto* call = wasm.allocator.alloc<Call>();
    // not all functions may exist yet, so type must be provided
    call->type = type;
    call->target = target;
    call->operands.set(args);
    call->isReturn = isReturn;
    return call;
  }